

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

void __thiscall
t_st_generator::st_getter(t_st_generator *this,ostream *out,string *cls,string *name)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  string *local_28;
  string *name_local;
  string *cls_local;
  ostream *out_local;
  t_st_generator *this_local;
  
  local_28 = name;
  name_local = cls;
  cls_local = (string *)out;
  out_local = (ostream *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)cls);
  std::operator+(&local_68,name,"");
  st_method(this,out,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = std::operator<<((ostream *)cls_local,"^ ");
  std::operator<<(poVar1,(string *)name);
  st_close_method(this,(ostream *)cls_local);
  return;
}

Assistant:

void t_st_generator::st_getter(std::ostream& out, string cls, string name) {
  st_method(out, cls, name + "");
  out << "^ " << name;
  st_close_method(out);
}